

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_unique.h
# Opt level: O2

unique_ptr<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>_> __thiscall
spvtools::
MakeUnique<spvtools::opt::IRContext,spv_target_env&,std::function<void(spv_message_level_t,char_const*,spv_position_t_const&,char_const*)>&>
          (spvtools *this,spv_target_env *args,
          function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
          *args_1)

{
  spv_target_env env;
  IRContext *this_00;
  _Any_data _Stack_48;
  _Manager_type local_38;
  
  this_00 = (IRContext *)::operator_new(0x250);
  env = *args;
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  function((function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
            *)&_Stack_48,args_1);
  opt::IRContext::IRContext(this_00,env,(MessageConsumer *)&_Stack_48);
  *(IRContext **)this = this_00;
  if (local_38 != (code *)0x0) {
    (*local_38)(&_Stack_48,&_Stack_48,__destroy_functor);
  }
  return (__uniq_ptr_data<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}